

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-mqtt-handshake.c
# Opt level: O0

lws * lws_mqtt_client_send_connect(lws *wsi)

{
  char cVar1;
  _lws_mqtt_related *p_Var2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte local_149;
  int iStack_148;
  uint8_t len;
  uint8_t *p;
  uint8_t *start;
  uint8_t b [272];
  lws_mqttc_t *c;
  lws *wsi_local;
  
  p_Var2 = wsi->mqtt;
  if ((short)wsi->wsistate == 0x121) {
    iVar3 = lws_mqtt_fill_fixed_header(b + 8,LMQCP_CTOS_CONNECT,'\0',QOS0,'\0');
    if (iVar3 == 0) {
      local_149 = (char)((p_Var2->client).id)->len + 0xc;
      if (((((p_Var2->client).conn_flags & 0x80) != 0) &&
          ((p_Var2->client).username != (lws_mqtt_str_t *)0x0)) &&
         (local_149 = local_149 + (char)((p_Var2->client).username)->len + '\x02',
         ((p_Var2->client).conn_flags & 0x40) != 0)) {
        if ((p_Var2->client).password == (lws_mqtt_str_t *)0x0) {
          cVar1 = '\0';
        }
        else {
          cVar1 = (char)((p_Var2->client).password)->len;
        }
        local_149 = local_149 + cVar1 + '\x02';
      }
      if ((((p_Var2->client).conn_flags & 4) != 0) &&
         ((p_Var2->client).will.topic != (lws_mqtt_str_t *)0x0)) {
        if ((p_Var2->client).will.message == (lws_mqtt_str_t *)0x0) {
          cVar1 = '\0';
        }
        else {
          cVar1 = (char)((p_Var2->client).will.message)->len;
        }
        local_149 = local_149 + (char)((p_Var2->client).will.topic)->len + cVar1 + '\x04';
      }
      iVar3 = lws_mqtt_vbi_encode((uint)local_149,b + 9);
      lVar5 = (long)iVar3;
      lws_ser_wu16be(b + 9 + lVar5,4);
      b[lVar5 + 0xb] = 'M';
      b[lVar5 + 0xc] = 'Q';
      b[lVar5 + 0xd] = 'T';
      b[lVar5 + 0xe] = 'T';
      b[lVar5 + 0xf] = '\x04';
      b[lVar5 + 0x10] = (p_Var2->client).conn_flags;
      lws_ser_wu16be(b + lVar5 + 0x11,(p_Var2->client).keep_alive_secs);
      if ((((p_Var2->client).id == (lws_mqtt_str_t *)0x0) || (((p_Var2->client).id)->len == 0)) ||
         ((((p_Var2->client).id)->buf == (uint8_t *)0x0 || (*((p_Var2->client).id)->buf == '\0'))))
      {
        if (((p_Var2->client).conn_flags & 2) == 0) {
          _lws_log(1,"%s: Empty client ID needs a clean start\n","lws_mqtt_client_send_connect");
          return (lws *)0x0;
        }
        _iStack_148 = b + lVar5 + 0x14;
        b[lVar5 + 0x13] = '\0';
      }
      else {
        lws_ser_wu16be(b + lVar5 + 0x13,((p_Var2->client).id)->len);
        memcpy(b + lVar5 + 0x15,((p_Var2->client).id)->buf,(ulong)((p_Var2->client).id)->len);
        _iStack_148 = b + lVar5 + 0x15 + (int)(uint)((p_Var2->client).id)->len;
      }
      if (((p_Var2->client).conn_flags & 0xfd) == 0) {
        *_iStack_148 = '\0';
        iStack_148 = (int)_iStack_148 + 1;
      }
      else {
        if (((p_Var2->client).conn_flags & 4) != 0) {
          if (((((p_Var2->client).will.topic == (lws_mqtt_str_t *)0x0) ||
               (((p_Var2->client).will.topic)->len == 0)) ||
              (((p_Var2->client).will.topic)->buf == (uint8_t *)0x0)) ||
             (*((p_Var2->client).will.topic)->buf == '\0')) {
            _lws_log(1,"%s: Missing Will Topic\n","lws_mqtt_client_send_connect");
            return (lws *)0x0;
          }
          lws_ser_wu16be(_iStack_148,((p_Var2->client).will.topic)->len);
          memcpy(_iStack_148 + 2,((p_Var2->client).will.topic)->buf,
                 (ulong)((p_Var2->client).will.topic)->len);
          _iStack_148 = _iStack_148 + 2 + (int)(uint)((p_Var2->client).will.topic)->len;
          if ((((p_Var2->client).will.message == (lws_mqtt_str_t *)0x0) ||
              (((p_Var2->client).will.message)->len == 0)) ||
             ((((p_Var2->client).will.message)->buf == (uint8_t *)0x0 ||
              (*((p_Var2->client).will.message)->buf == '\0')))) {
            lws_ser_wu16be(_iStack_148,0);
            _iStack_148 = _iStack_148 + 2;
          }
          else {
            lws_ser_wu16be(_iStack_148,((p_Var2->client).will.topic)->len);
            memcpy(_iStack_148 + 2,((p_Var2->client).will.message)->buf,
                   (ulong)((p_Var2->client).will.message)->len);
            _iStack_148 = _iStack_148 + 2 + (int)(uint)((p_Var2->client).will.message)->len;
          }
        }
        if (((p_Var2->client).conn_flags & 0x80) == 0) {
          if (((p_Var2->client).conn_flags & 0x40) != 0) {
            _lws_log(1,"%s: Unsupported - Password without username\n",
                     "lws_mqtt_client_send_connect");
            return (lws *)0x0;
          }
        }
        else {
          if ((((p_Var2->client).username == (lws_mqtt_str_t *)0x0) ||
              (((p_Var2->client).username)->len == 0)) ||
             ((((p_Var2->client).username)->buf == (uint8_t *)0x0 ||
              (*((p_Var2->client).username)->buf == '\0')))) {
            _lws_log(1,"%s: Empty / missing Username!\n","lws_mqtt_client_send_connect");
            return (lws *)0x0;
          }
          lws_ser_wu16be(_iStack_148,((p_Var2->client).username)->len);
          memcpy(_iStack_148 + 2,((p_Var2->client).username)->buf,
                 (ulong)((p_Var2->client).username)->len);
          _iStack_148 = _iStack_148 + 2 + (int)(uint)((p_Var2->client).username)->len;
          if (((p_Var2->client).conn_flags & 0x40) != 0) {
            if (((((p_Var2->client).password == (lws_mqtt_str_t *)0x0) ||
                 (((p_Var2->client).password)->len == 0)) ||
                (((p_Var2->client).password)->buf == (uint8_t *)0x0)) ||
               (*((p_Var2->client).password)->buf == '\0')) {
              lws_ser_wu16be(_iStack_148,0);
              _iStack_148 = _iStack_148 + 2;
            }
            else {
              lws_ser_wu16be(_iStack_148,((p_Var2->client).password)->len);
              memcpy(_iStack_148 + 2,((p_Var2->client).password)->buf,
                     (ulong)((p_Var2->client).password)->len);
              _iStack_148 = _iStack_148 + 2 + (int)(uint)((p_Var2->client).password)->len;
            }
          }
        }
      }
      iVar3 = (int)(b + 8);
      iVar4 = lws_write(wsi,b + 8,(long)(iStack_148 - iVar3),LWS_WRITE_BINARY);
      wsi_local = wsi;
      if (iVar4 != iStack_148 - iVar3) {
        _lws_log(4,"%s: write failed\n","lws_mqtt_client_send_connect");
        wsi_local = (lws *)0x0;
      }
    }
    else {
      _lws_log(1,"%s: Failled to fill fixed header\n","lws_mqtt_client_send_connect");
      wsi_local = (lws *)0x0;
    }
  }
  else {
    _lws_log(1,"%s: unexpected state %d\n","lws_mqtt_client_send_connect",
             (ulong)(wsi->wsistate & 0xffff));
    wsi_local = (lws *)0x0;
  }
  return wsi_local;
}

Assistant:

struct lws *
lws_mqtt_client_send_connect(struct lws *wsi)
{
	/* static int */
	/* 	lws_mqttc_abs_writeable(lws_abs_protocol_inst_t *api, size_t budget) */
	const lws_mqttc_t *c = &wsi->mqtt->client;
	uint8_t b[256 + LWS_PRE], *start = b + LWS_PRE, *p = start,
		len = MQTT_CONNECT_MSG_BASE_LEN;

	switch (lwsi_state(wsi)) {
	case LRS_MQTTC_IDLE:
		/*
		 * Transport connected - this is our chance to do the
		 * protocol connect action.
		 */

		/* 1. Fixed Headers */
		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_CONNECT, 0, 0, 0)) {
			lwsl_err("%s: Failled to fill fixed header\n", __func__);
			return NULL;
		}

		/*
		 * 2. Remaining length - Add the lengths of client ID,
		 * username and password and their length fields if
		 * the respective flags are set.
		 */
		len +=  c->id->len;
		if (c->conn_flags & LMQCFT_USERNAME && c->username) {
			len += c->username->len + 2;
			if (c->conn_flags & LMQCFT_PASSWORD)
				len += (c->password ? c->password->len : 0) + 2;
		}
		if (c->conn_flags & LMQCFT_WILL_FLAG && c->will.topic) {
			len += c->will.topic->len + 2;
			len += (c->will.message ? c->will.message->len : 0) + 2;
		}
		p += lws_mqtt_vbi_encode(len, p);

		/*
		 * 3. Variable Header - Protocol name & level, Connect
		 * flags and keep alive time (in secs).
		 */
		lws_ser_wu16be(p, 4); /* Length of protocol name */
		p += 2;
		*p++ = 'M';
		*p++ = 'Q';
		*p++ = 'T';
		*p++ = 'T';
		*p++ = MQTT_VER_3_1_1;
		*p++ = c->conn_flags;
		lws_ser_wu16be(p, c->keep_alive_secs);
		p += 2;

		/*
		 * 4. Payload - Client ID, Will topic & message,
		 * Username & password.
		 */
		if (lws_mqtt_str_is_not_empty(c->id)) {
			lws_ser_wu16be(p, c->id->len);
			p += 2;
			memcpy(p, c->id->buf, c->id->len);
			p += c->id->len;
		} else {
			/*
			 * If the Client supplies a zero-byte
			 * ClientId, the Client MUST also set
			 * CleanSession to 1 [MQTT-3.1.3-7].
			 */
			if (!(c->conn_flags & LMQCFT_CLEAN_START)) {
				lwsl_err("%s: Empty client ID needs a clean start\n",
					 __func__);
				return NULL;
			}
			*p++ = 0;
		}

		if ((c->conn_flags & ~LMQCFT_CLEAN_START) == 0) {
			*p++ = 0; /* no properties */
			break;
		}
		if (c->conn_flags & LMQCFT_WILL_FLAG) {
			if (lws_mqtt_str_is_not_empty(c->will.topic)) {
				lws_ser_wu16be(p, c->will.topic->len);
				p += 2;
				memcpy(p, c->will.topic->buf, c->will.topic->len);
				p += c->will.topic->len;
				if (lws_mqtt_str_is_not_empty(c->will.message)) {
					lws_ser_wu16be(p, c->will.topic->len);
					p += 2;
					memcpy(p, c->will.message->buf,
					       c->will.message->len);
					p += c->will.message->len;
				} else {
					lws_ser_wu16be(p, 0);
					p += 2;
				}
			} else {
				lwsl_err("%s: Missing Will Topic\n", __func__);
				return NULL;
			}
		}
		if (c->conn_flags & LMQCFT_USERNAME) {
			/*
			 * Detailed sanity check on the username and
			 * password strings.
			 */
			if (lws_mqtt_str_is_not_empty(c->username)) {
				lws_ser_wu16be(p, c->username->len);
				p += 2;
				memcpy(p, c->username->buf, c->username->len);
				p += c->username->len;
			} else {
				lwsl_err("%s: Empty / missing Username!\n",
					 __func__);
				return NULL;
			}
			if (c->conn_flags & LMQCFT_PASSWORD) {
				if (lws_mqtt_str_is_not_empty(c->password)) {
					lws_ser_wu16be(p, c->password->len);
					p += 2;
					memcpy(p, c->password->buf,
					       c->password->len);
					p += c->password->len;
				} else {
					lws_ser_wu16be(p, 0);
					p += 2;
				}
			}
		} else if (c->conn_flags & LMQCFT_PASSWORD) {
			lwsl_err("%s: Unsupported - Password without username\n",
				 __func__);
			return NULL;
		}
		break;
	default:
		lwsl_err("%s: unexpected state %d\n", __func__, lwsi_state(wsi));

		return NULL;
	}

	/*
	 * Perform the actual write
	 */
	if (lws_write(wsi, (unsigned char *)&b[LWS_PRE], lws_ptr_diff(p, start),
		  LWS_WRITE_BINARY) != lws_ptr_diff(p, start)) {
		lwsl_notice("%s: write failed\n", __func__);

		return NULL;
	}

	return wsi;
}